

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O2

void __thiscall
EightBallIRCCommand::trigger
          (EightBallIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string_view nick_local;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  char *local_28;
  
  nick_local._M_str = nick._M_str;
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  nick_local._M_len = (size_t)args_2;
  iVar2 = rand();
  switch((long)iVar2 % 0x1f & 0xffffffff) {
  case 0:
    local_70._M_dataplus._M_p = (pointer)0x3;
    local_70._M_string_length = 0x1060c1;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 1:
    local_70._M_dataplus._M_p = (pointer)0x4;
    local_70._M_string_length = 0x1060c5;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 2:
    local_70._M_dataplus._M_p = (pointer)0x6;
    local_70._M_string_length = 0x1060ca;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 3:
    local_70._M_dataplus._M_p = (pointer)0x6;
    local_70._M_string_length = 0x1060d1;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 4:
    local_70._M_dataplus._M_p = (pointer)0x14;
    local_70._M_string_length = 0x1060d8;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 5:
    local_70._M_dataplus._M_p = (pointer)0x26;
    local_70._M_string_length = 0x1060ed;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 6:
    local_70._M_dataplus._M_p = (pointer)0x42;
    local_70._M_string_length = 0x106114;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 7:
    local_70._M_dataplus._M_p = (pointer)0x9;
    local_70._M_string_length = 0x106157;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 8:
    local_70._M_dataplus._M_p = (pointer)0x8;
    local_70._M_string_length = 0x106161;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 9:
    local_70._M_dataplus._M_p = (pointer)0x1b;
    local_70._M_string_length = 0x10616a;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 10:
    local_30 = 4;
    local_28 = "Hai ";
    local_40._M_len = 1;
    local_40._M_str = "!";
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_70,(jessilib *)&local_30,&nick_local,&local_40,args_2);
    goto LAB_001049e7;
  case 0xb:
    local_30 = 10;
    local_28 = "Let\'s ban ";
    local_40._M_len = 1;
    local_40._M_str = "!";
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_70,(jessilib *)&local_30,&nick_local,&local_40,args_2);
LAB_001049e7:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&msg,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case 0xc:
    local_70._M_dataplus._M_p = (pointer)0x12;
    local_70._M_string_length = 0x106196;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0xd:
    __y._M_str = "#Jail";
    __y._M_len = 5;
    bVar1 = std::operator==(channel,__y);
    if (bVar1) {
      local_70._M_dataplus._M_p = (pointer)0x2b;
      local_70._M_string_length = 0x1061a9;
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    }
    else {
      local_70._M_dataplus._M_p = (pointer)0x27;
      local_70._M_string_length = 0x1061d5;
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    }
    break;
  case 0xe:
    local_70._M_dataplus._M_p = (pointer)0x1d;
    local_70._M_string_length = 0x1061fd;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0xf:
    local_70._M_dataplus._M_p = (pointer)0x1c;
    local_70._M_string_length = 0x10621b;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x10:
    local_70._M_dataplus._M_p = (pointer)0x18;
    local_70._M_string_length = 0x106238;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x11:
    local_70._M_dataplus._M_p = (pointer)0x10;
    local_70._M_string_length = 0x106251;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x12:
    local_70._M_dataplus._M_p = (pointer)0x16;
    local_70._M_string_length = 0x106262;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x13:
    local_70._M_dataplus._M_p = (pointer)0x1f;
    local_70._M_string_length = 0x106279;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x14:
    local_70._M_dataplus._M_p = (pointer)0x23;
    local_70._M_string_length = 0x106299;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x15:
    local_70._M_dataplus._M_p = (pointer)0x8e;
    local_70._M_string_length = 0x1062bd;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x16:
    local_70._M_dataplus._M_p = (pointer)0x7d;
    local_70._M_string_length = 0x10634c;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x17:
    local_70._M_dataplus._M_p = (pointer)0xb1;
    local_70._M_string_length = 0x1063ca;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x18:
    local_70._M_dataplus._M_p = (pointer)0x10;
    local_70._M_string_length = 0x10647c;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x19:
    local_70._M_dataplus._M_p = (pointer)0x77;
    local_70._M_string_length = 0x10648d;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x1a:
    local_70._M_dataplus._M_p = (pointer)0x45;
    local_70._M_string_length = 0x106505;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x1b:
    local_70._M_dataplus._M_p = (pointer)0x4;
    local_70._M_string_length = 0x10654b;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x1c:
    local_70._M_dataplus._M_p = (pointer)0x50;
    local_70._M_string_length = 0x106550;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x1d:
    local_70._M_dataplus._M_p = (pointer)0x3e;
    local_70._M_string_length = 0x1065a1;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  case 0x1e:
    local_70._M_dataplus._M_p = (pointer)0x53;
    local_70._M_string_length = 0x1065e0;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
    break;
  default:
    local_70._M_dataplus._M_p = (pointer)0x1e;
    local_70._M_string_length = 0x106634;
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,(basic_string_view<char,_std::char_traits<char>_> *)&local_70);
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel._M_len,channel._M_str,msg._M_string_length,msg._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void EightBallIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string msg;
	switch (rand() % 31)
	{
	case 0:
		msg = "No."sv;
		break;
	case 1:
		msg = "Yes."sv;
		break;
	case 2:
		msg = "Maybe."sv;
		break;
	case 3:
		msg = "Seven."sv;
		break;
	case 4:
		msg = "Consider counseling."sv;
		break;
	case 5:
		msg = "Look into a realationship. A real one."sv;
		break;
	case 6:
		msg = "Quit asking me these deep questions, before I get deeply into you."sv;
		break;
	case 7:
		msg = "Fuck you."sv;
		break;
	case 8:
		msg = "Fuck me."sv;
		break;
	case 9:
		msg = "Good thing I bend that way!"sv;
		break;
	case 10:
		msg = jessilib::join<std::string>("Hai "sv, nick, "!"sv);
		break;
	case 11:
		msg = jessilib::join<std::string>("Let's ban "sv, nick, "!"sv);
		break;
	case 12:
		msg = "Fuck your lineage."sv;
		break;
	case 13:
		if (channel == "#Jail"sv) {
			msg = "Ask me those kind of questions in #Politics"sv;
		}
		else {
			msg = "Ask me those kind of questions in #Jail"sv;
		}
		break;
	case 14:
		msg = "I don't talk to slut-mongers."sv;
		break;
	case 15:
		msg = "I only talk to slut-mongers."sv;
		break;
	case 16:
		msg = "Nuclear launch detected."sv;
		break;
	case 17:
		msg = "404 - Not found."sv;
		break;
	case 18:
		msg = "I hurr u liek mudkipz?"sv;
		break;
	case 19:
		msg = "Fortune might be in your favor."sv;
		break;
	case 20:
		msg = "Fortune might not be in your favor."sv;
		break;
	case 21:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, you're going to hell."sv;
		break;
	case 22:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, yes!"sv;
		break;
	case 23:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, it's approximately as likely as getting a \"yes\" from me."sv;
		break;
	case 24:
		msg = "Fucking campers."sv;
		break;
	case 25:
		msg = "The 8ball seems to be stuck. Try again later. (Dang, you can't even get an 8ball to work for you? That's pretty sad yo)"sv;
		break;
	case 26:
		msg = "The 8ball says... Go away? Wow, it really must not like you. Go away."sv;
		break;
	case 27:
		msg = "Swag"sv;
		break;
	case 28:
		msg = "Based on the orbit and trajectory of the 33rd moon of the planet assinine 6, no."sv;
		break;
	case 29:
		msg = "Based on the orbin and trajectory of the moon assinsix 9, yes!"sv;
		break;
	case 30:
		msg = "Come visit me on the 5th planet away from Sol, and I'll give you whatever you want."sv;
		break;
	default:
		msg = "Nothingness. You suck. Go rot."sv;
		break;
	}
	source->sendMessage(channel, msg);
}